

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  longlong lVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  void *pvVar6;
  long lVar7;
  double dVar8;
  float afStack_341a8 [2];
  float vec [2000];
  float bestd [40];
  char st [100] [2000];
  char file_name [2000];
  char *bestw [40];
  char st1 [2000];
  char *vocab;
  float *M;
  longlong bi [100];
  longlong cn;
  longlong d;
  longlong c;
  longlong b;
  longlong a;
  longlong size;
  longlong words;
  float len;
  float dist;
  FILE *local_20;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  _len = afStack_341a8;
  argv_local._4_4_ = 0;
  f = (FILE *)argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    _len = afStack_341a8;
    printf("Usage: ./distance <FILE>\nwhere FILE contains word projections in the BINARY FORMAT\n");
    argv_local._4_4_ = 0;
  }
  else {
    strcpy(st[99] + 0x7c8,argv[1]);
    local_20 = fopen(st[99] + 0x7c8,"rb");
    if (local_20 == (FILE *)0x0) {
      printf("Input file not found\n");
      argv_local._4_4_ = -1;
    }
    else {
      __isoc99_fscanf(local_20,"%lld",&size);
      __isoc99_fscanf(local_20,"%lld",&a);
      pvVar4 = malloc(size * 0x32);
      for (b = 0; b < 0x28; b = b + 1) {
        pcVar5 = (char *)malloc(2000);
        bestw[b + -1] = pcVar5;
      }
      pvVar6 = malloc(size * a * 4);
      if (pvVar6 == (void *)0x0) {
        printf("Cannot allocate memory: %lld MB    %lld  %lld\n",(ulong)(size * a * 4) >> 0x14,size,
               a);
        argv_local._4_4_ = -1;
      }
      else {
        for (c = 0; c < size; c = c + 1) {
          b = 0;
          while( true ) {
            iVar3 = fgetc(local_20);
            *(char *)((long)pvVar4 + c * 0x32 + b) = (char)iVar3;
            iVar3 = feof(local_20);
            if ((iVar3 != 0) || (*(char *)((long)pvVar4 + c * 0x32 + b) == ' ')) break;
            if ((b < 0x32) && (*(char *)((long)pvVar4 + c * 0x32 + b) != '\n')) {
              b = b + 1;
            }
          }
          *(undefined1 *)((long)pvVar4 + c * 0x32 + b) = 0;
          for (b = 0; b < a; b = b + 1) {
            fread((void *)((long)pvVar6 + (b + c * a) * 4),4,1,local_20);
          }
          words._0_4_ = 0.0;
          for (b = 0; b < a; b = b + 1) {
            words._0_4_ = *(float *)((long)pvVar6 + (b + c * a) * 4) *
                          *(float *)((long)pvVar6 + (b + c * a) * 4) + (float)words;
          }
          dVar8 = sqrt((double)(float)words);
          words._0_4_ = (float)dVar8;
          for (b = 0; b < a; b = b + 1) {
            lVar7 = b + c * a;
            *(float *)((long)pvVar6 + lVar7 * 4) =
                 *(float *)((long)pvVar6 + lVar7 * 4) / (float)words;
          }
        }
        fclose(local_20);
        while( true ) {
          for (b = 0; b < 0x28; b = b + 1) {
            vec[b + 0x7ce] = 0.0;
          }
          for (b = 0; b < 0x28; b = b + 1) {
            *bestw[b + -1] = '\0';
          }
          printf("Enter word or sentence (EXIT to break): ");
          b = 0;
          while( true ) {
            iVar3 = fgetc(_stdin);
            *(char *)((long)bestw + b + 0x138) = (char)iVar3;
            if ((*(char *)((long)bestw + b + 0x138) == '\n') || (0x7ce < b)) break;
            b = b + 1;
          }
          *(undefined1 *)((long)bestw + b + 0x138) = 0;
          iVar3 = strcmp((char *)(bestw + 0x27),"EXIT");
          if (iVar3 == 0) break;
          bi[99] = 0;
          c = 0;
          d = 0;
          lVar2 = d;
          while( true ) {
            d = lVar2;
            st[bi[99] + -1][c + 0x7c8] = *(char *)((long)bestw + d + 0x138);
            st[bi[99] + -1][c + 0x7c9] = '\0';
            if (*(char *)((long)bestw + d + 0x139) == '\0') break;
            lVar2 = d + 1;
            c = c + 1;
            if (*(char *)((long)bestw + d + 0x139) == ' ') {
              bi[99] = bi[99] + 1;
              c = 0;
              lVar2 = d + 2;
            }
          }
          bi[99] = bi[99] + 1;
          c = c + 1;
          for (b = 0; b < bi[99]; b = b + 1) {
            c = 0;
            while ((c < size &&
                   (iVar3 = strcmp((char *)((long)pvVar4 + c * 0x32),st[b + -1] + 0x7c8), iVar3 != 0
                   ))) {
              c = c + 1;
            }
            if (c == size) {
              c = -1;
            }
            bi[b + -1] = c;
            printf("\nWord: %s  Position in vocabulary: %lld\n",st[b + -1] + 0x7c8,bi[b + -1]);
            if (c == -1) {
              printf("Out of dictionary word!\n");
              break;
            }
          }
          if (c != -1) {
            printf(
                  "\n                                              Word       Cosine distance\n------------------------------------------------------------------------\n"
                  );
            for (b = 0; b < a; b = b + 1) {
              afStack_341a8[b] = 0.0;
            }
            for (c = 0; c < bi[99]; c = c + 1) {
              if (bi[c + -1] != -1) {
                for (b = 0; b < a; b = b + 1) {
                  afStack_341a8[b] =
                       *(float *)((long)pvVar6 + (b + bi[c + -1] * a) * 4) + afStack_341a8[b];
                }
              }
            }
            words._0_4_ = 0.0;
            for (b = 0; b < a; b = b + 1) {
              words._0_4_ = afStack_341a8[b] * afStack_341a8[b] + (float)words;
            }
            dVar8 = sqrt((double)(float)words);
            words._0_4_ = (float)dVar8;
            for (b = 0; b < a; b = b + 1) {
              afStack_341a8[b] = afStack_341a8[b] / (float)dVar8;
            }
            for (b = 0; b < 0x28; b = b + 1) {
              vec[b + 0x7ce] = -1.0;
            }
            for (b = 0; b < 0x28; b = b + 1) {
              *bestw[b + -1] = '\0';
            }
            for (d = 0; d < size; d = d + 1) {
              bVar1 = false;
              for (c = 0; c < bi[99]; c = c + 1) {
                if (bi[c + -1] == d) {
                  bVar1 = true;
                }
              }
              if (!bVar1) {
                words._4_4_ = 0.0;
                for (b = 0; b < a; b = b + 1) {
                  words._4_4_ = afStack_341a8[b] * *(float *)((long)pvVar6 + (b + d * a) * 4) +
                                words._4_4_;
                }
                b = 0;
LAB_00101a78:
                if (b < 0x28) {
                  if (words._4_4_ < vec[b + 0x7ce] || words._4_4_ == vec[b + 0x7ce])
                  goto LAB_00101b2f;
                  for (cn = 0x27; b < cn; cn = cn + -1) {
                    vec[cn + 0x7ce] = vec[cn + 0x7cd];
                    strcpy(bestw[cn + -1],bestw[cn + -2]);
                  }
                  vec[b + 0x7ce] = words._4_4_;
                  strcpy(bestw[b + -1],(char *)((long)pvVar4 + d * 0x32));
                }
              }
            }
            for (b = 0; b < 0x28; b = b + 1) {
              printf("%50s\t\t%f\n",(double)vec[b + 0x7ce],bestw[b + -1]);
            }
          }
        }
        argv_local._4_4_ = 0;
      }
    }
  }
  return argv_local._4_4_;
LAB_00101b2f:
  b = b + 1;
  goto LAB_00101a78;
}

Assistant:

int main(int argc, char **argv) {
  FILE *f;
  char st1[max_size];
  char *bestw[N];
  char file_name[max_size], st[100][max_size];
  float dist, len, bestd[N], vec[max_size];
  long long words, size, a, b, c, d, cn, bi[100];
  // char ch;
  float *M;
  char *vocab;
  if (argc < 2) {
    printf("Usage: ./distance <FILE>\nwhere FILE contains word projections in the BINARY FORMAT\n");
    return 0;
  }
  strcpy(file_name, argv[1]);
  f = fopen(file_name, "rb");
  if (f == NULL) {
    printf("Input file not found\n");
    return -1;
  }
  fscanf(f, "%lld", &words);
  fscanf(f, "%lld", &size);
  vocab = (char *)malloc((long long)words * max_w * sizeof(char));
  for (a = 0; a < N; a++) bestw[a] = (char *)malloc(max_size * sizeof(char));
  M = (float *)malloc((long long)words * (long long)size * sizeof(float));
  if (M == NULL) {
    printf("Cannot allocate memory: %lld MB    %lld  %lld\n", (long long)words * size * sizeof(float) / 1048576, words, size);
    return -1;
  }
  for (b = 0; b < words; b++) {
    a = 0;
    while (1) {
      vocab[b * max_w + a] = fgetc(f);
      if (feof(f) || (vocab[b * max_w + a] == ' ')) break;
      if ((a < max_w) && (vocab[b * max_w + a] != '\n')) a++;
    }
    vocab[b * max_w + a] = 0;
    for (a = 0; a < size; a++) fread(&M[a + b * size], sizeof(float), 1, f);
    len = 0;
    for (a = 0; a < size; a++) len += M[a + b * size] * M[a + b * size];
    len = sqrt(len);
    for (a = 0; a < size; a++) M[a + b * size] /= len;
  }
  fclose(f);
  while (1) {
    for (a = 0; a < N; a++) bestd[a] = 0;
    for (a = 0; a < N; a++) bestw[a][0] = 0;
    printf("Enter word or sentence (EXIT to break): ");
    a = 0;
    while (1) {
      st1[a] = fgetc(stdin);
      if ((st1[a] == '\n') || (a >= max_size - 1)) {
        st1[a] = 0;
        break;
      }
      a++;
    }
    if (!strcmp(st1, "EXIT")) break;
    cn = 0;
    b = 0;
    c = 0;
    while (1) {
      st[cn][b] = st1[c];
      b++;
      c++;
      st[cn][b] = 0;
      if (st1[c] == 0) break;
      if (st1[c] == ' ') {
        cn++;
        b = 0;
        c++;
      }
    }
    cn++;
    for (a = 0; a < cn; a++) {
      for (b = 0; b < words; b++) if (!strcmp(&vocab[b * max_w], st[a])) break;
      if (b == words) b = -1;
      bi[a] = b;
      printf("\nWord: %s  Position in vocabulary: %lld\n", st[a], bi[a]);
      if (b == -1) {
        printf("Out of dictionary word!\n");
        break;
      }
    }
    if (b == -1) continue;
    printf("\n                                              Word       Cosine distance\n------------------------------------------------------------------------\n");
    for (a = 0; a < size; a++) vec[a] = 0;
    for (b = 0; b < cn; b++) {
      if (bi[b] == -1) continue;
      for (a = 0; a < size; a++) vec[a] += M[a + bi[b] * size];
    }
    len = 0;
    for (a = 0; a < size; a++) len += vec[a] * vec[a];
    len = sqrt(len);
    for (a = 0; a < size; a++) vec[a] /= len;
    for (a = 0; a < N; a++) bestd[a] = -1;
    for (a = 0; a < N; a++) bestw[a][0] = 0;
    for (c = 0; c < words; c++) {
      a = 0;
      for (b = 0; b < cn; b++) if (bi[b] == c) a = 1;
      if (a == 1) continue;
      dist = 0;
      for (a = 0; a < size; a++) dist += vec[a] * M[a + c * size];
      for (a = 0; a < N; a++) {
        if (dist > bestd[a]) {
          for (d = N - 1; d > a; d--) {
            bestd[d] = bestd[d - 1];
            strcpy(bestw[d], bestw[d - 1]);
          }
          bestd[a] = dist;
          strcpy(bestw[a], &vocab[c * max_w]);
          break;
        }
      }
    }
    for (a = 0; a < N; a++) printf("%50s\t\t%f\n", bestw[a], bestd[a]);
  }
  return 0;
}